

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

void __thiscall CMU462::StaticScene::Triangle::draw(Triangle *this,Color *c)

{
  Color *c_local;
  Triangle *this_local;
  
  glColor4f(c->r,c->g,c->b,c->a);
  glBegin(4);
  glVertex3d(this->mesh->positions[this->v1].x,this->mesh->positions[this->v1].y,
             this->mesh->positions[this->v1].z);
  glVertex3d(this->mesh->positions[this->v2].x,this->mesh->positions[this->v2].y,
             this->mesh->positions[this->v2].z);
  glVertex3d(this->mesh->positions[this->v3].x,this->mesh->positions[this->v3].y,
             this->mesh->positions[this->v3].z);
  glEnd();
  return;
}

Assistant:

void Triangle::draw(const Color& c) const {
  glColor4f(c.r, c.g, c.b, c.a);
  glBegin(GL_TRIANGLES);
  glVertex3d(mesh->positions[v1].x,
             mesh->positions[v1].y,
             mesh->positions[v1].z);
  glVertex3d(mesh->positions[v2].x,
             mesh->positions[v2].y,
             mesh->positions[v2].z);
  glVertex3d(mesh->positions[v3].x,
             mesh->positions[v3].y,
             mesh->positions[v3].z);
  glEnd();
}